

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsCreateDataView(JsValueRef arrayBuffer,uint byteOffset,uint byteLength,JsValueRef *result)

{
  anon_class_32_4_afed1ee6 fn;
  JsErrorCode JVar1;
  uint *in_stack_ffffffffffffffb8;
  JsValueRef *local_20;
  JsValueRef *result_local;
  uint byteLength_local;
  uint byteOffset_local;
  JsValueRef arrayBuffer_local;
  
  fn.result = (JsValueRef **)((long)&result_local + 4);
  fn.arrayBuffer = &local_20;
  fn.byteOffset = (uint *)&result_local;
  fn.byteLength = in_stack_ffffffffffffffb8;
  local_20 = result;
  result_local._0_4_ = byteLength;
  result_local._4_4_ = byteOffset;
  _byteLength_local = arrayBuffer;
  JVar1 = ContextAPIWrapper<false,JsCreateDataView::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateDataView(_In_ JsValueRef arrayBuffer, _In_ unsigned int byteOffset, _In_ unsigned int byteLength, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_REFERENCE(arrayBuffer, scriptContext);
        PARAM_NOT_NULL(result);

        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptLibrary* library = scriptContext->GetLibrary();
        *result = library->CreateDataView(Js::VarTo<Js::ArrayBuffer>(arrayBuffer), byteOffset, byteLength);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(*result));
        return JsNoError;
    });
}